

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropout_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Dropout_x86::forward_inplace(Dropout_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  undefined8 *puVar5;
  long *in_RSI;
  long *in_RDI;
  __m128 _p_2;
  int i_2;
  float *ptr_2;
  int q;
  __m128 _p_1;
  int j;
  float *ptr_1;
  int i_1;
  __m128 _p;
  float *ptr;
  int i;
  __m128 _scale;
  int size;
  int channels;
  int h;
  int w;
  int elempack;
  int dims;
  Mat *m;
  undefined8 local_2e8;
  undefined8 uStackY_2e0;
  int local_2d0;
  undefined8 *local_278;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  int iVar6;
  Mat *in_stack_fffffffffffffd98;
  Dropout *in_stack_fffffffffffffda0;
  int local_24c;
  undefined8 *local_248;
  int local_23c;
  undefined8 local_238;
  undefined8 uStack_230;
  int local_21c;
  int local_1cc;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  
  fVar1 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
  if ((fVar1 != 1.0) || (NAN(fVar1))) {
    iVar6 = (int)in_RSI[5];
    if ((int)in_RSI[3] == 4) {
      iVar2 = *(int *)((long)in_RSI + 0x2c);
      lVar3 = in_RSI[6];
      lVar4 = in_RSI[7];
      fVar1 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
      if (iVar6 == 1) {
        for (local_21c = 0; local_21c < iVar2; local_21c = local_21c + 1) {
          puVar5 = (undefined8 *)(*in_RSI + (long)(local_21c << 2) * 4);
          local_138 = (float)*puVar5;
          fStack_134 = (float)((ulong)*puVar5 >> 0x20);
          fStack_130 = (float)puVar5[1];
          fStack_12c = (float)((ulong)puVar5[1] >> 0x20);
          local_238 = CONCAT44(fStack_134 * fVar1,local_138 * fVar1);
          uStack_230 = CONCAT44(fStack_12c * fVar1,fStack_130 * fVar1);
          *puVar5 = local_238;
          puVar5[1] = uStack_230;
        }
      }
      if (iVar6 == 2) {
        for (local_23c = 0; local_23c < (int)lVar3; local_23c = local_23c + 1) {
          local_248 = (undefined8 *)
                      (*in_RSI + (long)*(int *)((long)in_RSI + 0x2c) * (long)local_23c * in_RSI[2]);
          for (local_24c = 0; local_24c < iVar2; local_24c = local_24c + 1) {
            local_158 = (float)*local_248;
            fStack_154 = (float)((ulong)*local_248 >> 0x20);
            fStack_150 = (float)local_248[1];
            fStack_14c = (float)((ulong)local_248[1] >> 0x20);
            *local_248 = CONCAT44(fStack_154 * fVar1,local_158 * fVar1);
            local_248[1] = CONCAT44(fStack_14c * fVar1,fStack_150 * fVar1);
            local_248 = local_248 + 2;
          }
        }
      }
      if (iVar6 == 3) {
        for (iVar6 = 0; iVar6 < (int)lVar4; iVar6 = iVar6 + 1) {
          local_278 = (undefined8 *)(*in_RSI + in_RSI[8] * (long)iVar6 * in_RSI[2]);
          for (local_2d0 = 0; local_2d0 < iVar2 * (int)lVar3; local_2d0 = local_2d0 + 1) {
            local_178 = (float)*local_278;
            fStack_174 = (float)((ulong)*local_278 >> 0x20);
            fStack_170 = (float)local_278[1];
            fStack_16c = (float)((ulong)local_278[1] >> 0x20);
            local_2e8 = CONCAT44(fStack_174 * fVar1,local_178 * fVar1);
            uStackY_2e0 = CONCAT44(fStack_16c * fVar1,fStack_170 * fVar1);
            *local_278 = local_2e8;
            local_278[1] = uStackY_2e0;
            local_278 = local_278 + 2;
          }
        }
      }
      local_1cc = 0;
    }
    else {
      local_1cc = Dropout::forward_inplace
                            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                             (Option *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90)
                            );
    }
  }
  else {
    local_1cc = 0;
  }
  return local_1cc;
}

Assistant:

int Dropout_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (scale == 1.f)
    {
        return 0;
    }

#if __SSE2__
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_top_blob, tmp, 8, opt);

        forward_inplace(tmp, opt);

        convert_packing(tmp, bottom_top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m256 _scale = _mm256_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 8;
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_mul_ps(_p, _scale);
                _mm256_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m128 _scale = _mm_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 4;
                __m128 _p = _mm_loadu_ps(ptr);
                _p = _mm_mul_ps(_p, _scale);
                _mm_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    return Dropout::forward_inplace(bottom_top_blob, opt);
}